

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::DropDirectoryItem
          (cmComputeLinkInformation *this,
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *item
          )

{
  cmake *this_00;
  string *b;
  string sStack_38;
  
  this_00 = this->CMakeInstance;
  b = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
  cmStrCat<char_const(&)[9],std::__cxx11::string_const&,char_const(&)[34],std::__cxx11::string_const&,char_const(&)[69]>
            (&sStack_38,(char (*) [9])0x722418,b,
             (char (*) [34])"\" requests linking to directory \"",&item->Value,
             (char (*) [69])"\".  Targets may link only to libraries.  CMake is dropping the item.")
  ;
  cmake::IssueMessage(this_00,WARNING,&sStack_38,&item->Backtrace);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void cmComputeLinkInformation::DropDirectoryItem(BT<std::string> const& item)
{
  // A full path to a directory was found as a link item.  Warn the
  // user.
  this->CMakeInstance->IssueMessage(
    MessageType::WARNING,
    cmStrCat("Target \"", this->Target->GetName(),
             "\" requests linking to directory \"", item.Value,
             "\".  Targets may link only to libraries.  CMake is dropping "
             "the item."),
    item.Backtrace);
}